

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O1

void setupTestInstruction(Setup *s,u32 pc,u16 opcode)

{
  u16 uVar1;
  InstrInfo IVar2;
  
  IVar2 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,opcode);
  if ((IVar2.I == MOVEC) && ((s->round & 1) != 0)) {
    s->ext1 = s->ext1 & 0xf000;
  }
  s->pc = pc;
  s->opcode = opcode;
  s->mem[pc & 0xffff] = (u8)(opcode >> 8);
  s->mem[pc + 1 & 0xffff] = (u8)opcode;
  uVar1 = s->ext1;
  s->mem[pc + 2 & 0xffff] = (u8)(uVar1 >> 8);
  s->mem[pc + 3 & 0xffff] = (u8)uVar1;
  uVar1 = s->ext2;
  s->mem[pc + 4 & 0xffff] = (u8)(uVar1 >> 8);
  s->mem[pc + 5 & 0xffff] = (u8)uVar1;
  uVar1 = s->ext3;
  s->mem[pc + 6 & 0xffff] = (u8)(uVar1 >> 8);
  s->mem[pc + 7 & 0xffff] = (u8)uVar1;
  memcpy(musashiMem,s->mem,0x10000);
  memcpy(moiraMem,s->mem,0x10000);
  return;
}

Assistant:

void setupTestInstruction(Setup &s, u32 pc, u16 opcode)
{
    static long mvc = 0;

    moira::Instr instr = moiracpu->getInstrInfo(opcode).I;

    // Prepare special extension words for some instructions
    switch (instr) {

        case Instr::RTE:

            break;

        case Instr::MOVEC:
        {
            if (s.round % 2) {

                s.ext1 &= 0xF000;
                if (mvc % 2) s.ext1 |= 0x800;
                s.ext1 |= (mvc >> 2) & 0xFF;
            }
            break;
        }
        default:
            break;
    }

    s.pc = pc;
    s.opcode = opcode;

    set16(s.mem, pc, opcode);
    set16(s.mem, pc + 2, s.ext1);
    set16(s.mem, pc + 4, s.ext2);
    set16(s.mem, pc + 6, s.ext3);

    memcpy(musashiMem, s.mem, sizeof(musashiMem));
    memcpy(moiraMem, s.mem, sizeof(moiraMem));
}